

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

char __thiscall Fl_Preferences::RootNode::getPath(RootNode *this,char *path,int pathlen)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  
  if (this->filename_ == (char *)0x0) {
    return '\x01';
  }
  fl_strlcpy(path,this->filename_,(long)pathlen);
  pcVar3 = path;
  do {
    if (*pcVar3 == '\\') {
      *pcVar3 = '/';
    }
    else if (*pcVar3 == '\0') {
      pcVar3 = strrchr(path,0x2e);
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
        cVar1 = fl_make_path(path);
        iVar2 = strncmp(path,"/etc/fltk/",10);
        if (iVar2 == 0) {
          fl_chmod(path,0x1ed);
        }
        pcVar3[0] = '/';
        pcVar3[1] = '\0';
        return cVar1;
      }
      return '\0';
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

char Fl_Preferences::RootNode::getPath( char *path, int pathlen ) {
  if (!filename_)   // RUNTIME preferences
    return 1; // return 1 (not -1) to be consistent with fl_make_path()
  strlcpy( path, filename_, pathlen); 

  char *s;
  for ( s = path; *s; s++ ) if ( *s == '\\' ) *s = '/';
  s = strrchr( path, '.' );
  if ( !s ) return 0;
  *s = 0;
  char ret = fl_make_path( path );
#if !(defined(__APPLE__) || defined(WIN32))
  // unix: make sure that system prefs dir. is user-readable
  if (strncmp(path, "/etc/fltk/", 10) == 0) {
    fl_chmod(path, 0755); // rwxr-xr-x
  }
#endif
  strcpy( s, "/" );
  return ret;
}